

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_build_rwkv6_base::build_rwkv6_channel_mix
          (llm_build_rwkv6_base *this,llama_layer *layer,ggml_tensor *cur,ggml_tensor *x_prev,
          llm_arch arch)

{
  undefined8 uVar1;
  llm_graph_context *this_00;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *cur_00;
  ggml_tensor *pgVar4;
  undefined8 uVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  ggml_tensor *k;
  ggml_tensor *r;
  ggml_tensor *xr;
  ggml_tensor *xk;
  ggml_tensor *sx;
  
  this_00 = (llm_graph_context *)ggml_sub(*(undefined8 *)(in_RDI + 0xc0),in_RCX,in_RDX);
  if (in_R8D == 0x38) {
    uVar1 = *(undefined8 *)(in_RDI + 0xc0);
    uVar2 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),this_00,*(undefined8 *)(in_RSI + 0x390));
    pgVar3 = (ggml_tensor *)ggml_add(uVar1,uVar2,in_RDX);
    uVar1 = *(undefined8 *)(in_RDI + 0xc0);
    uVar2 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),this_00,*(undefined8 *)(in_RSI + 0x398));
    cur_00 = (ggml_tensor *)ggml_add(uVar1,uVar2,in_RDX);
    uVar1 = *(undefined8 *)(in_RDI + 0xc0);
    pgVar4 = llm_graph_context::build_lora_mm(this_00,pgVar3,cur_00);
    uVar5 = ggml_sigmoid(uVar1,pgVar4);
    uVar1 = *(undefined8 *)(in_RDI + 0xc0);
    uVar2 = *(undefined8 *)(in_RDI + 0xc0);
    pgVar4 = llm_graph_context::build_lora_mm(this_00,pgVar3,cur_00);
    uVar2 = ggml_relu(uVar2,pgVar4);
    ggml_sqr(uVar1,uVar2);
    uVar1 = *(undefined8 *)(in_RDI + 0xc0);
    pgVar3 = llm_graph_context::build_lora_mm(this_00,pgVar3,cur_00);
    pgVar3 = (ggml_tensor *)ggml_mul(uVar1,uVar5,pgVar3);
    return pgVar3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2c85,"fatal error");
}

Assistant:

ggml_tensor * build_rwkv6_channel_mix(
            const llama_layer * layer,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            llm_arch arch) const {
        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);
        switch (arch) {
            case LLM_ARCH_RWKV6:
                {
                    ggml_tensor * xk = ggml_add(ctx0, ggml_mul(ctx0, sx, layer->channel_mix_lerp_k), cur);
                    ggml_tensor * xr = ggml_add(ctx0, ggml_mul(ctx0, sx, layer->channel_mix_lerp_r), cur);

                    ggml_tensor * r = ggml_sigmoid(ctx0, build_lora_mm(layer->channel_mix_receptance, xr));
                    ggml_tensor * k = ggml_sqr(
                            ctx0,
                            ggml_relu(
                                ctx0,
                                build_lora_mm(layer->channel_mix_key, xk)
                                )
                            );
                    cur = ggml_mul(ctx0, r, build_lora_mm(layer->channel_mix_value, k));
                } break;
            default:
                GGML_ABORT("fatal error");
        }

        return cur;
    }